

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::getSpacingModeShaderName(SpacingMode mode)

{
  char *pcStack_10;
  SpacingMode mode_local;
  
  if (mode == SPACINGMODE_EQUAL) {
    pcStack_10 = "equal_spacing";
  }
  else if (mode == SPACINGMODE_FRACTIONAL_ODD) {
    pcStack_10 = "fractional_odd_spacing";
  }
  else if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    pcStack_10 = "fractional_even_spacing";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char* getSpacingModeShaderName (SpacingMode mode)
{
	switch (mode)
	{
		case SPACINGMODE_EQUAL:				return "equal_spacing";
		case SPACINGMODE_FRACTIONAL_ODD:	return "fractional_odd_spacing";
		case SPACINGMODE_FRACTIONAL_EVEN:	return "fractional_even_spacing";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}